

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsbr.cpp
# Opt level: O3

void __thiscall unodb::detail::qsbr_epoch::dump(qsbr_epoch *this,ostream *os)

{
  std::__ostream_insert<char,std::char_traits<char>>(os,"epoch = ",8);
  std::ostream::_M_insert<unsigned_long>((ulong)os);
  if (this->epoch_val < 4) {
    return;
  }
  __assert_fail("epoch_val <= max",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.hpp"
                ,0x9c,"void unodb::detail::qsbr_epoch::assert_invariant() const");
}

Assistant:

[[gnu::cold]] UNODB_DETAIL_NOINLINE void detail::qsbr_epoch::dump(
    std::ostream &os) const {
  os << "epoch = " << static_cast<std::uint64_t>(epoch_val);
#ifndef NDEBUG
  assert_invariant();
#endif
}